

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86regalloc.cpp
# Opt level: O2

Error __thiscall
asmjit::X86RAPass::emitImmToReg(X86RAPass *this,uint32_t dstTypeId,uint32_t dstPhysId,Imm *src)

{
  Imm imm;
  anon_union_16_7_ed616b9d_for_Operand__0 local_28;
  anon_union_16_7_ed616b9d_for_Operand__0 local_18;
  
  if (dstPhysId == 0xff) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/x86regalloc.cpp"
               ,0x113,"dstPhysId != Globals::kInvalidRegId");
  }
  local_18._packed[0] = (UInt64)0x0;
  local_18._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x0;
  local_28._packed[0].field_10 = (src->super_Operand).super_Operand_.field_0._packed[0];
  local_28._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)
       ((anon_union_8_2_78723da6_for_MemData_2 *)
       ((long)&(src->super_Operand).super_Operand_.field_0 + 8))->offset64;
  switch(dstTypeId) {
  case 0x22:
  case 0x23:
    local_28._mem.field_2 =
         (anon_union_8_2_78723da6_for_MemData_2)((ulong)local_28._mem.field_2 & 0xff);
  case 0x24:
  case 0x25:
    local_28._mem.field_2 =
         (anon_union_8_2_78723da6_for_MemData_2)((ulong)local_28._mem.field_2 & 0xffff);
  case 0x26:
  case 0x27:
switchD_0011f905_caseD_26:
    local_28._mem.field_2 =
         (anon_union_8_2_78723da6_for_MemData_2)((ulong)local_28._mem.field_2 & 0xffffffff);
    local_18._any.signature = 0x4000029;
    break;
  case 0x28:
  case 0x29:
    local_18._any.signature = 0x8000031;
    if (local_28._any.reserved12_4 == 0) goto switchD_0011f905_caseD_26;
    break;
  case 0x2a:
  case 0x2b:
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/hypeartist[P]asmjit-1/src/asmjit/x86/x86regalloc.cpp"
               ,0x139,"ASMJIT_NOT_REACHED has been reached");
  default:
    goto switchD_0011f905_default;
  }
  local_18._any.id = dstPhysId;
  CodeEmitter::emit(&((this->super_RAPass).super_CBPass._cb)->super_CodeEmitter,0x189,
                    (Operand_ *)&local_18._any,(Operand_ *)&local_28._any);
switchD_0011f905_default:
  return 0;
}

Assistant:

Error X86RAPass::emitImmToReg(uint32_t dstTypeId, uint32_t dstPhysId, const Imm* src) noexcept {
  ASMJIT_ASSERT(dstPhysId != Globals::kInvalidRegId);

  X86Reg r0;
  Imm imm(*src);

  switch (dstTypeId) {
    case TypeId::kI8:
    case TypeId::kU8:
      imm.truncateTo8Bits();
      ASMJIT_FALLTHROUGH;

    case TypeId::kI16:
    case TypeId::kU16:
      imm.truncateTo16Bits();
      ASMJIT_FALLTHROUGH;

    case TypeId::kI32:
    case TypeId::kU32:
Mov32Truncate:
      imm.truncateTo32Bits();
      r0.setX86RegT<X86Reg::kRegGpd>(dstPhysId);
      cc()->emit(X86Inst::kIdMov, r0, imm);
      break;

    case TypeId::kI64:
    case TypeId::kU64:
      // Move to GPD register will also clear the high DWORD of GPQ
      // register in 64-bit mode.
      if (imm.isUInt32())
        goto Mov32Truncate;

      r0.setX86RegT<X86Reg::kRegGpq>(dstPhysId);
      cc()->emit(X86Inst::kIdMov, r0, imm);
      break;

    case TypeId::kF32:
    case TypeId::kF64:
      // Compiler doesn't manage FPU stack.
      ASMJIT_NOT_REACHED();
      break;

    case TypeId::kMmx32:
    case TypeId::kMmx64:
      // TODO: [COMPILER] EmitMoveImmToReg.
      break;

    default:
      // TODO: [COMPILER] EmitMoveImmToReg.
      break;
  }

  return kErrorOk;
}